

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger base_error(HSQUIRRELVM v)

{
  SQPRINTFUNCTION p_Var1;
  SQChar *in_RAX;
  SQRESULT SVar2;
  SQInteger SVar3;
  SQChar *str;
  
  str = in_RAX;
  SVar2 = sq_tostring(v,2);
  SVar3 = -1;
  if (-1 < SVar2) {
    SVar2 = sq_getstring(v,-1,&str);
    if (-1 < SVar2) {
      p_Var1 = v->_sharedstate->_errorfunc;
      if (p_Var1 == (SQPRINTFUNCTION)0x0) {
        SVar3 = 0;
      }
      else {
        SVar3 = 0;
        (*p_Var1)(v,"%s",str);
      }
    }
  }
  return SVar3;
}

Assistant:

static SQInteger base_error(HSQUIRRELVM v)
{
    const SQChar *str;
    if(SQ_SUCCEEDED(sq_tostring(v,2)))
    {
        if(SQ_SUCCEEDED(sq_getstring(v,-1,&str))) {
            if(_ss(v)->_errorfunc) _ss(v)->_errorfunc(v,_SC("%s"),str);
            return 0;
        }
    }
    return SQ_ERROR;
}